

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O2

void __thiscall
gmlc::utilities::stringOps::trimString(stringOps *this,string *input,string_view whitespace)

{
  _If_sv<std::basic_string_view<char>,_size_type> _Var1;
  string_view whitespace_local;
  
  whitespace_local._M_str = (char *)whitespace._M_len;
  whitespace_local._M_len = (size_t)input;
  _Var1 = std::__cxx11::string::
          find_last_not_of<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)this,&whitespace_local,0xffffffffffffffff);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,_Var1 + 1,
             0xffffffffffffffff);
  _Var1 = std::__cxx11::string::
          find_first_not_of<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)this,&whitespace_local,0);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,0,_Var1);
  return;
}

Assistant:

void trimString(std::string& input, std::string_view whitespace)
    {
        input.erase(input.find_last_not_of(whitespace) + 1);
        input.erase(0, input.find_first_not_of(whitespace));
    }